

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O3

void __thiscall OSTEI_HRR_Writer::WriteHRR_Ket_Inline_(OSTEI_HRR_Writer *this,ostream *os,QAM *am)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  OSTEI_HRR_Algorithm_Base *this_00;
  int ncart;
  long lVar3;
  uint uVar4;
  HRRDoubletStepList ketsteps;
  string bra_str;
  string ncart_bra_str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined1 *local_108;
  undefined8 local_100;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  _Type local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [8];
  undefined8 uStack_b8;
  HRRDoubletStepList local_b0;
  string local_98;
  DAM local_78;
  string local_50;
  
  local_e8 = *(_Type *)(am->qam)._M_elems;
  uStack_e0 = 0;
  local_108 = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
  local_d8._0_4_ = local_e8[0];
  local_d8._4_4_ = local_e8[1];
  if (local_108 == local_f8) {
    uStack_b8 = uStack_f0;
    local_d0 = local_c0;
  }
  else {
    local_d0 = local_108;
  }
  local_c8 = local_100;
  local_100 = 0;
  local_f8[0] = 0;
  local_98._M_dataplus._M_p._0_4_ = 1;
  lVar3 = 0;
  do {
    iVar2 = *(int *)((long)&local_d8 + lVar3);
    uVar4 = (uint)((iVar2 + 1) * (iVar2 + 2)) >> 1;
    if (iVar2 < 0) {
      uVar4 = 0;
    }
    local_98._M_dataplus._M_p._0_4_ = (int)local_98._M_dataplus._M_p * uVar4;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  local_108 = local_f8;
  StringBuilder<int>(&local_50,(int *)&local_98);
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108);
  }
  StringBuilder<char,char_const(&)[2],char_const&>
            (&local_98,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + (am->qam)._M_elems[0],
             (char (*) [2])0x148cbc,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + (am->qam)._M_elems[1])
  ;
  this_00 = this->hrr_algo_;
  local_e8 = *(_Type *)((am->qam)._M_elems + 2);
  uStack_e0 = 0;
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
  paVar1 = &local_78.tag.field_2;
  local_78.dam._M_elems[0] = local_e8[0];
  local_78.dam._M_elems[1] = local_e8[1];
  if (local_128 == &local_118) {
    local_78.tag.field_2._8_8_ = local_118._8_8_;
    local_78.tag._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_78.tag._M_dataplus._M_p = (pointer)local_128;
  }
  local_78.tag._M_string_length = local_120;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_128 = &local_118;
  OSTEI_HRR_Algorithm_Base::GetKetSteps(&local_b0,this_00,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.tag._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.tag._M_dataplus._M_p);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128);
  }
  WriteKetSteps_(this,os,&local_b0,&am->tag,&local_50,&local_98);
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::~vector(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_98._M_dataplus._M_p._4_4_,(int)local_98._M_dataplus._M_p) !=
      &local_98.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_98._M_dataplus._M_p._4_4_,(int)local_98._M_dataplus._M_p));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRR_Ket_Inline_(std::ostream & os, QAM am) const
{
    // ncart_bra in string form
    std::string ncart_bra_str = StringBuilder(NCART(DAM{am[0], am[1]}));

    // the bra part in string form
    std::string bra_str = StringBuilder(amchar[am[0]], "_", amchar[am[1]]);

    auto ketsteps = hrr_algo_.GetKetSteps(DAM{am[2], am[3]});
    WriteKetSteps_(os, ketsteps, am.tag, ncart_bra_str, bra_str);
}